

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool parse_float(char **begin,char *end,float *number)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pbVar2 = (byte *)*begin;
  fVar6 = 1.0;
  if (pbVar2 < end) {
    if (*pbVar2 == 0x2d) {
      pbVar2 = pbVar2 + 1;
      fVar6 = -1.0;
    }
    else if (*pbVar2 == 0x2b) {
      pbVar2 = pbVar2 + 1;
    }
  }
  if (pbVar2 < end) {
    bVar5 = *pbVar2;
    fVar10 = 0.0;
    if (bVar5 == 0x2e) {
      fVar9 = 0.0;
      pbVar4 = pbVar2;
    }
    else {
      if (9 < (byte)(bVar5 - 0x30)) goto LAB_00105e90;
      fVar9 = 0.0;
      do {
        pbVar2 = pbVar2 + 1;
        fVar9 = fVar9 * 10.0 + (float)(int)(bVar5 - 0x30);
        pbVar4 = (byte *)end;
        if (end <= pbVar2) break;
        bVar5 = *pbVar2;
        pbVar4 = pbVar2;
      } while ((byte)(bVar5 - 0x30) < 10);
    }
    if ((pbVar4 < end) && (*pbVar4 == 0x2e)) {
      if ((end <= pbVar4 + 1) || (bVar5 = pbVar4[1], 9 < (byte)(bVar5 - 0x30))) goto LAB_00105e90;
      fVar7 = 1.0;
      fVar10 = 0.0;
      pbVar2 = pbVar4 + 2;
      do {
        fVar10 = fVar10 * 10.0 + (float)(int)(bVar5 - 0x30);
        fVar7 = fVar7 * 10.0;
        pbVar4 = (byte *)end;
        if (end <= pbVar2) break;
        bVar5 = *pbVar2;
        pbVar4 = pbVar2;
        pbVar2 = pbVar2 + 1;
      } while ((byte)(bVar5 - 0x30) < 10);
      fVar10 = fVar10 / fVar7;
    }
    pbVar2 = pbVar4 + 1;
    fVar7 = 1.0;
    if ((((pbVar2 < end) && ((*pbVar4 | 0x20) == 0x65)) && (bVar5 = *pbVar2, bVar5 != 0x78)) &&
       (bVar5 != 0x6d)) {
      pbVar3 = pbVar4 + 2;
      if (bVar5 == 0x2b) {
        fVar7 = 1.0;
      }
      else {
        if (bVar5 != 0x2d) {
          pbVar3 = pbVar2;
        }
        fVar7 = *(float *)(&DAT_00122200 + (ulong)(bVar5 == 0x2d) * 4);
      }
      if ((end <= pbVar3) || (bVar5 = *pbVar3, 9 < (byte)(bVar5 - 0x30))) goto LAB_00105e90;
      fVar8 = 0.0;
      do {
        pbVar3 = pbVar3 + 1;
        fVar8 = fVar8 * 10.0 + (float)(int)(bVar5 - 0x30);
        pbVar4 = (byte *)end;
        if (end <= pbVar3) break;
        bVar5 = *pbVar3;
        pbVar4 = pbVar3;
      } while ((byte)(bVar5 - 0x30) < 10);
    }
    else {
      fVar8 = 0.0;
    }
    *begin = (char *)pbVar4;
    fVar6 = fVar6 * (fVar9 + fVar10);
    *number = fVar6;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      fVar6 = powf(10.0,fVar8 * fVar7);
      fVar6 = fVar6 * *number;
      *number = fVar6;
    }
    bVar1 = ABS(fVar6) <= 3.4028235e+38;
  }
  else {
LAB_00105e90:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static inline bool parse_float(const char** begin, const char* end, float* number)
{
    const char* it = *begin;
    float integer = 0;
    float fraction = 0;
    float exponent = 0;
    int sign = 1;
    int expsign = 1;

    if(it < end && *it == '+')
        ++it;
    else if(it < end && *it == '-') {
        ++it;
        sign = -1;
    }

    if(it >= end || (*it != '.' && !IS_NUM(*it)))
        return false;
    if(IS_NUM(*it)) {
        do {
            integer = 10.f * integer + (*it++ - '0');
        } while(it < end && IS_NUM(*it));
    }

    if(it < end && *it == '.') {
        ++it;
        if(it >= end || !IS_NUM(*it))
            return false;
        float divisor = 1.f;
        do {
            fraction = 10.f * fraction + (*it++ - '0');
            divisor *= 10.f;
        } while(it < end && IS_NUM(*it));
        fraction /= divisor;
    }

    if(it + 1 < end && (it[0] == 'e' || it[0] == 'E') && (it[1] != 'x' && it[1] != 'm')) {
        ++it;
        if(it < end && *it == '+')
            ++it;
        else if(it < end && *it == '-') {
            ++it;
            expsign = -1;
        }

        if(it >= end || !IS_NUM(*it))
            return false;
        do {
            exponent = 10 * exponent + (*it++ - '0');
        } while(it < end && IS_NUM(*it));
    }

    *begin = it;
    *number = sign * (integer + fraction);
    if(exponent)
        *number *= powf(10.f, expsign * exponent);
    return *number >= -FLT_MAX && *number <= FLT_MAX;
}